

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CbString.cpp
# Opt level: O3

CbString * __thiscall
Hpipe::CbString::read_line
          (CbString *__return_storage_ptr__,CbString *this,char sep,bool skip_void_lines)

{
  byte bVar1;
  Buffer *pBVar2;
  Buffer *pBVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  PI8 *pPVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong b_len;
  
  if ((int)CONCAT71(in_register_00000009,skip_void_lines) == 0) {
    uVar9 = this->off;
    uVar4 = this->end;
LAB_00137087:
    if (uVar9 < uVar4) {
      pBVar2 = this->beg;
      uVar10 = pBVar2->used;
      uVar5 = uVar4 - uVar10;
      uVar6 = (uint)uVar9;
      if (uVar4 < uVar10 || uVar5 == 0) {
        uVar10 = uVar4;
        if (uVar6 < (uint)uVar4) {
          uVar9 = uVar9 & 0xffffffff;
          bVar1 = pBVar2->data[uVar9];
          uVar8 = uVar6;
          while ((uVar10 = uVar9, (uint)bVar1 != (int)sep &&
                 (uVar8 = uVar8 + 1, uVar10 = uVar4, (uint)uVar4 != uVar8))) {
            bVar1 = pBVar2->data[uVar9 + 1];
            uVar9 = uVar9 + 1;
          }
        }
        b_len = 0;
        uVar9 = (ulong)((int)uVar10 - uVar6);
      }
      else {
        pBVar3 = pBVar2->next;
        uVar8 = (uint)uVar10;
        if (uVar6 < uVar8) {
          uVar9 = uVar9 & 0xffffffff;
          if ((uint)pBVar2->data[uVar9] == (int)sep) goto LAB_001370c0;
          pPVar7 = pBVar2->data;
          lVar11 = 0;
          do {
            pPVar7 = pPVar7 + 1;
            if ((uVar6 - uVar8) + 1 == (int)lVar11) {
              uVar9 = (uVar9 - lVar11) + 1;
              b_len = (ulong)(uVar8 - uVar6);
              goto LAB_0013725f;
            }
            lVar11 = lVar11 + -1;
          } while ((uint)pPVar7[uVar9] != (int)sep);
          uVar9 = uVar9 - lVar11;
          b_len = -lVar11;
LAB_0013725f:
          if (uVar9 < (uVar10 & 0xffffffff)) goto LAB_00137101;
        }
        else {
          b_len = (ulong)(uVar8 - uVar6);
        }
        if (pBVar3 == (Buffer *)0x0) goto LAB_00137101;
        uVar4 = pBVar3->used;
        if (uVar4 < uVar5) {
          uVar6 = (uint)sep;
          do {
            pBVar2 = pBVar3->next;
            uVar9 = uVar4 & 0xffffffff;
            if (uVar9 != 0) {
              if (pBVar3->data[0] == uVar6) goto LAB_00137101;
              uVar10 = 0;
              do {
                if (uVar9 - 1 == uVar10) {
                  b_len = b_len + uVar9;
                  goto LAB_0013718d;
                }
                lVar11 = uVar10 + 1;
                uVar10 = uVar10 + 1;
              } while (pBVar3->data[lVar11] != uVar6);
              b_len = b_len + uVar10;
              if (uVar10 < uVar9) goto LAB_00137101;
            }
LAB_0013718d:
            uVar4 = uVar5 - uVar4;
            uVar10 = pBVar2->used;
            uVar5 = uVar4 - uVar10;
            if (uVar4 < uVar10 || uVar5 == 0) {
              uVar4 = uVar4 & 0xffffffff;
              if ((uVar4 == 0) || (pBVar2->data[0] == uVar6)) goto LAB_00137280;
              uVar10 = 0;
              goto LAB_0013728d;
            }
            pBVar3 = pBVar2->next;
            uVar10 = uVar10 & 0xffffffff;
            if (uVar10 != 0) {
              if (pBVar2->data[0] == uVar6) goto LAB_00137101;
              uVar9 = 0;
              do {
                if (uVar10 - 1 == uVar9) {
                  b_len = b_len + uVar10;
                  goto LAB_001371df;
                }
                lVar11 = uVar9 + 1;
                uVar9 = uVar9 + 1;
              } while (pBVar2->data[lVar11] != uVar6);
              if (uVar9 < uVar10) goto LAB_001370fe;
              b_len = b_len + uVar9;
            }
LAB_001371df:
            uVar4 = pBVar3->used;
          } while (uVar4 < uVar5);
        }
        uVar5 = uVar5 & 0xffffffff;
        if ((uVar5 == 0) || ((uint)pBVar3->data[0] == (int)sep)) {
LAB_00137280:
          uVar9 = 0;
        }
        else {
          uVar4 = 0;
          do {
            uVar9 = uVar5;
            if (uVar5 - 1 == uVar4) break;
            lVar11 = uVar4 + 1;
            uVar9 = uVar4 + 1;
            uVar4 = uVar9;
          } while ((uint)pBVar3->data[lVar11] != (int)sep);
        }
      }
      goto LAB_001370fe;
    }
  }
  else {
    uVar9 = this->off;
    uVar4 = this->end;
    if (uVar4 != uVar9) {
      if ((uint)this->beg->data[uVar9] == (int)sep) {
        b_len = 0;
        do {
          read_byte(this);
          uVar9 = this->off;
          uVar4 = this->end;
          if (uVar4 == uVar9) goto LAB_00137101;
        } while ((uint)this->beg->data[uVar9] == (int)sep);
      }
      goto LAB_00137087;
    }
  }
LAB_001370c0:
  b_len = 0;
  goto LAB_00137101;
  while (lVar11 = uVar10 + 1, uVar10 = uVar10 + 1, uVar9 = uVar10, pBVar2->data[lVar11] != uVar6) {
LAB_0013728d:
    uVar9 = uVar4;
    if (uVar4 - 1 == uVar10) break;
  }
LAB_001370fe:
  b_len = b_len + uVar9;
LAB_00137101:
  CbString(__return_storage_ptr__,this,0,b_len);
  skip_some(this,b_len + 1);
  return __return_storage_ptr__;
}

Assistant:

CbString CbString::read_line( char sep, bool skip_void_lines ) {
    if ( skip_void_lines )
        while ( not empty() and *ptr() == sep )
            skip_byte();
    // find sep
    PT pcr = 0;
    visitor( [ &pcr, sep ]( const Buffer *b, unsigned off, unsigned used ) {
        for( unsigned val = off; val < used; ++val ) {
            if ( b->data[ val ] == sep ) {
                pcr += val - off;
                return false;
            }
        }
        pcr += used - off;
        return true;
    } );
    CbString res{ *this, 0, pcr };
    skip_some( pcr + 1 );
    return res;
}